

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint uVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *__s2;
  long lVar5;
  __node_base *p_Var6;
  pointer ppcVar7;
  string fastTarget;
  string make;
  string compiler;
  char *in_stack_ffffffffffffff30;
  allocator local_b1;
  cmExtraSublimeTextGenerator *local_b0;
  cmGeneratedFileStream *local_a8;
  MapSourceFileFlags *local_a0;
  string local_98;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_78;
  char *local_70 [4];
  string local_50;
  
  local_b0 = this;
  local_a8 = fout;
  local_a0 = sourceFileFlags;
  std::__cxx11::string::string((string *)&local_50,"CMAKE_MAKE_PROGRAM",(allocator *)&local_98);
  pcVar4 = cmMakefile::GetRequiredDefinition(mf,&local_50);
  std::__cxx11::string::string((string *)local_70,pcVar4,&local_b1);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_98);
  ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar7 !=
      (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&local_98,"all",&local_b1);
    AppendTarget(local_b0,local_a8,&local_98,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmTarget *)0x0,local_70[0],mf,
                 in_stack_ffffffffffffff30,local_a0,true);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::string((string *)&local_98,"clean",&local_b1);
    AppendTarget(local_b0,local_a8,&local_98,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,(cmTarget *)0x0,local_70[0],mf,
                 in_stack_ffffffffffffff30,local_a0,false);
    std::__cxx11::string::~string((string *)&local_98);
    ppcVar7 = (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
  }
  local_78 = lgs;
  do {
    if (ppcVar7 ==
        (local_78->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)local_70);
      return;
    }
    this_00 = (*ppcVar7)->Makefile;
    p_Var6 = &(this_00->Targets)._M_h._M_before_begin;
LAB_003634b7:
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var6 + 1);
      uVar1 = *(uint *)&p_Var6[0x61]._M_nxt;
      if (uVar1 < 5) {
        AppendTarget(local_b0,local_a8,__lhs,*ppcVar7,(cmTarget *)(p_Var6 + 5),local_70[0],this_00,
                     in_stack_ffffffffffffff30,local_a0,false);
        std::__cxx11::string::string((string *)&local_98,(string *)__lhs);
        std::__cxx11::string::append((char *)&local_98);
        AppendTarget(local_b0,local_a8,&local_98,*ppcVar7,(cmTarget *)(p_Var6 + 5),local_70[0],
                     this_00,in_stack_ffffffffffffff30,local_a0,false);
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        if (uVar1 == 5) goto LAB_0036359c;
        if (uVar1 == 6) {
          pcVar4 = cmMakefile::GetCurrentBinaryDirectory(this_00);
          __s2 = cmMakefile::GetHomeOutputDirectory(this_00);
          iVar3 = strcmp(pcVar4,__s2);
          if (iVar3 == 0) goto LAB_00363623;
        }
      }
    }
    ppcVar7 = ppcVar7 + 1;
  } while( true );
LAB_0036359c:
  lVar5 = std::__cxx11::string::find((char *)__lhs,0x47fa80);
  if ((((lVar5 != 0) || (bVar2 = std::operator!=(__lhs,"Nightly"), !bVar2)) &&
      ((lVar5 = std::__cxx11::string::find((char *)__lhs,0x47fa88), lVar5 != 0 ||
       (bVar2 = std::operator!=(__lhs,"Continuous"), !bVar2)))) &&
     ((lVar5 = std::__cxx11::string::find((char *)__lhs,0x47fa93), lVar5 != 0 ||
      (bVar2 = std::operator!=(__lhs,"Experimental"), !bVar2)))) {
LAB_00363623:
    AppendTarget(local_b0,local_a8,__lhs,*ppcVar7,(cmTarget *)0x0,local_70[0],this_00,
                 in_stack_ffffffffffffff30,local_a0,false);
  }
  goto LAB_003634b7;
}

Assistant:

void cmExtraSublimeTextGenerator::
  AppendAllTargets(const std::vector<cmLocalGenerator*>& lgs,
                   const cmMakefile* mf,
                   cmGeneratedFileStream& fout,
                   MapSourceFileFlags& sourceFileFlags)
{
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = "";
  if (!lgs.empty())
    {
      this->AppendTarget(fout, "all", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, true);
      this->AppendTarget(fout, "clean", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, false);
    }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp(makefile->GetCurrentBinaryDirectory(),
                     makefile->GetHomeOutputDirectory())==0)
            {
            this->AppendTarget(fout, ti->first, *lg, 0,
                               make.c_str(), makefile, compiler.c_str(),
                               sourceFileFlags, false);
            }
          }
          break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
             || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
             || ((ti->first.find("Experimental")==0)
                                               && (ti->first!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, ti->first, *lg, 0,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, ti->first, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          }
          break;
        default:
          break;
        }
      }
    }
}